

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitStore(I64ToI32Lowering *this,Store *curr)

{
  uint uVar1;
  address64_t aVar2;
  Builder *this_00;
  byte bVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 uVar6;
  byte bVar7;
  iterator iVar8;
  LocalSet *any;
  Expression *pEVar9;
  Expression *pEVar10;
  Store *this_01;
  Block *pBVar11;
  ulong uVar12;
  undefined1 local_90 [8];
  TempVar highBits;
  undefined1 local_58 [8];
  TempVar ptrTemp;
  
  local_90 = (undefined1  [8])curr->value;
  iVar8 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->highBitVars)._M_h,(key_type *)local_90);
  if (iVar8.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
      ._M_cur != (__node_type *)0x0) {
    if (0xfffffffffffffffb < (curr->offset).addr) {
      __assert_fail("curr->offset + 4 > curr->offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x1cc,"void wasm::I64ToI32Lowering::visitStore(Store *)");
    }
    if (curr->isAtomic == true) {
      __assert_fail("!curr->isAtomic && \"atomic store not implemented\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x1cd,"void wasm::I64ToI32Lowering::visitStore(Store *)");
    }
    fetchOutParam((TempVar *)local_90,this,curr->value);
    bVar7 = (byte)*(undefined4 *)&curr->bytes;
    bVar3 = bVar7;
    if (3 < bVar7) {
      bVar3 = 4;
    }
    uVar1 = (uint)(curr->align).addr;
    uVar12 = 4;
    if (uVar1 < 4) {
      uVar12 = (ulong)uVar1;
    }
    curr->bytes = bVar3;
    (curr->align).addr = uVar12;
    (curr->valueType).id = 2;
    if (bVar7 == 8) {
      getTemp((TempVar *)local_58,this,(Type)0x2);
      if ((char)ptrTemp.pass == '\x01') {
LAB_008d7298:
        __assert_fail("!moved",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
      }
      any = Builder::makeLocalSet
                      ((this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,local_58._0_4_,
                       curr->ptr);
      uVar6 = local_58._0_4_;
      if ((char)ptrTemp.pass == '\x01') goto LAB_008d7298;
      pEVar9 = (Expression *)
               MixedArena::allocSpace
                         (&((this->builder)._M_t.
                            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                            .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                           allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      *(undefined4 *)(pEVar9 + 1) = uVar6;
      (pEVar9->type).id = 2;
      curr->ptr = pEVar9;
      Store::finalize(curr);
      uVar1 = (uint)(curr->align).addr;
      ptrTemp.ty.id._0_4_ = 4;
      if (uVar1 < 4) {
        ptrTemp.ty.id._0_4_ = uVar1;
      }
      if ((char)ptrTemp.pass == '\x01') goto LAB_008d7298;
      highBits.ty.id =
           (uintptr_t)
           (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      aVar2 = (curr->offset).addr;
      pEVar9 = (Expression *)
               MixedArena::allocSpace(&((Builder *)highBits.ty.id)->wasm->allocator,0x18,8);
      pEVar9->_id = LocalGetId;
      *(undefined4 *)(pEVar9 + 1) = local_58._0_4_;
      (pEVar9->type).id = 2;
      if ((char)highBits.pass == '\x01') goto LAB_008d7298;
      ptrTemp.ty.id._4_4_ = local_90._0_4_;
      pEVar10 = (Expression *)
                MixedArena::allocSpace
                          (&((this->builder)._M_t.
                             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                             .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                            allocator,0x18,8);
      pEVar10->_id = LocalGetId;
      *(Index *)(pEVar10 + 1) = ptrTemp.ty.id._4_4_;
      (pEVar10->type).id = 2;
      sVar4 = (curr->memory).super_IString.str._M_len;
      pcVar5 = (curr->memory).super_IString.str._M_str;
      this_01 = (Store *)MixedArena::allocSpace
                                   ((MixedArena *)(*(long *)highBits.ty.id + 0x200),0x58,8);
      *(undefined8 *)&(this_01->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression
           = 0;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
      *(undefined8 *)&this_01->bytes = 0;
      (this_01->offset).addr = 0;
      (this_01->align).addr = 0;
      *(undefined8 *)&this_01->isAtomic = 0;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
      this_01->bytes = '\x04';
      (this_01->offset).addr = aVar2 + 4;
      (this_01->align).addr = (ulong)(uint)ptrTemp.ty.id;
      this_01->ptr = pEVar9;
      this_01->value = pEVar10;
      (this_01->valueType).id = 2;
      (this_01->memory).super_IString.str._M_len = sVar4;
      (this_01->memory).super_IString.str._M_str = pcVar5;
      Store::finalize(this_01);
      this_00 = (this->builder)._M_t.
                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      pBVar11 = Builder::blockify(this_00,(Expression *)any,(Expression *)curr);
      pBVar11 = Builder::blockify(this_00,(Expression *)pBVar11,(Expression *)this_01);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar11);
      TempVar::~TempVar((TempVar *)local_58);
    }
    TempVar::~TempVar((TempVar *)local_90);
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (!hasOutParam(curr->value)) {
      return;
    }
    assert(curr->offset + 4 > curr->offset);
    assert(!curr->isAtomic && "atomic store not implemented");
    TempVar highBits = fetchOutParam(curr->value);
    uint8_t bytes = curr->bytes;
    curr->bytes = std::min(curr->bytes, uint8_t(4));
    curr->align = std::min(uint32_t(curr->align), uint32_t(4));
    curr->valueType = Type::i32;
    if (bytes == 8) {
      TempVar ptrTemp = getTemp();
      LocalSet* setPtr = builder->makeLocalSet(ptrTemp, curr->ptr);
      curr->ptr = builder->makeLocalGet(ptrTemp, Type::i32);
      curr->finalize();
      Store* storeHigh =
        builder->makeStore(4,
                           curr->offset + 4,
                           std::min(uint32_t(curr->align), uint32_t(4)),
                           builder->makeLocalGet(ptrTemp, Type::i32),
                           builder->makeLocalGet(highBits, Type::i32),
                           Type::i32,
                           curr->memory);
      replaceCurrent(builder->blockify(setPtr, curr, storeHigh));
    }
  }